

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createTextureCall
          (Builder *this,Decoration precision,Id resultType,bool sparse,bool fetch,bool proj,
          bool gather,bool noImplicitLod,TextureParameters *parameters)

{
  Vector<Id> *this_00;
  iterator iVar1;
  Block *pBVar2;
  bool bVar3;
  Builder *pBVar4;
  Decoration precision_00;
  Op OVar5;
  Id IVar6;
  Id IVar7;
  Instruction *instruction;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  undefined3 in_register_00000089;
  int op;
  ulong uVar12;
  Op OVar13;
  uint uVar14;
  Instruction *raw_instruction;
  Id texArgs [10];
  Capability local_94;
  Builder *local_90;
  Id local_88;
  Id local_84;
  Id local_80;
  Id local_7c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_78;
  uint local_70;
  Decoration local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  ulong local_38;
  
  local_88 = CONCAT31(in_register_00000089,proj);
  local_58 = 0;
  uStack_50 = 0;
  uStack_60 = 0;
  local_48 = 0;
  local_68._0_4_ = parameters->sampler;
  local_68._4_4_ = parameters->coords;
  if (parameters->Dref == 0) {
    uVar11 = 2;
  }
  else {
    uStack_60 = (ulong)parameters->Dref;
    uVar11 = 3;
  }
  local_38 = uVar11;
  if (parameters->component != 0) {
    local_38 = (ulong)((int)uVar11 + 1);
    *(Id *)((long)&local_68 + uVar11 * 4) = parameters->component;
  }
  local_70 = (int)local_38 + 1;
  IVar6 = parameters->bias;
  uVar10 = local_70;
  if (IVar6 != 0) {
    *(Id *)((long)&local_68 + (ulong)local_70 * 4) = IVar6;
    uVar10 = (int)local_38 + 2;
  }
  uVar14 = (uint)(IVar6 != 0);
  IVar6 = parameters->lod;
  local_90 = this;
  local_7c = resultType;
  if (IVar6 == 0) {
    if (parameters->gradX != 0) {
      uVar14 = uVar14 | 4;
      uVar8 = uVar10 + 1;
      *(Id *)((long)&local_68 + (ulong)uVar10 * 4) = parameters->gradX;
      IVar6 = parameters->gradY;
      iVar9 = 2;
      goto LAB_001b6cef;
    }
    if ((!fetch && !gather) && noImplicitLod) {
      IVar6 = makeFloatConstant(this,0.0,false);
      goto LAB_001b6cc6;
    }
    bVar3 = false;
  }
  else {
LAB_001b6cc6:
    uVar14 = uVar14 | 2;
    iVar9 = 1;
    uVar8 = uVar10;
LAB_001b6cef:
    uVar10 = uVar10 + iVar9;
    *(Id *)((long)&local_68 + (ulong)uVar8 * 4) = IVar6;
    bVar3 = true;
  }
  uVar8 = parameters->offset;
  if ((ulong)uVar8 != 0) {
    uVar11 = (ulong)(local_90->module).idToInstruction.
                    super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar8]->opCode;
    if ((uVar11 < 0x35) && ((0x1f7e0000000002U >> (uVar11 & 0x3f) & 1) != 0)) {
      uVar14 = uVar14 | 8;
    }
    else {
      local_94 = CapabilityImageGatherExtended;
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&local_90->capabilities,&local_94);
      uVar14 = uVar14 | 0x10;
      uVar8 = parameters->offset;
    }
    uVar11 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    *(uint *)((long)&local_68 + uVar11 * 4) = uVar8;
  }
  if (parameters->offsets != 0) {
    uVar14 = uVar14 | 0x20;
    uVar11 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    *(Id *)((long)&local_68 + uVar11 * 4) = parameters->offsets;
  }
  if (parameters->sample != 0) {
    uVar14 = uVar14 | 0x40;
    uVar11 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    *(Id *)((long)&local_68 + uVar11 * 4) = parameters->sample;
  }
  uVar11 = local_38 & 0xffffffff;
  local_6c = precision;
  if (parameters->lodClamp == 0) {
    if (uVar14 != 0) goto LAB_001b6db9;
    uVar10 = uVar10 - 1;
  }
  else {
    local_94 = CapabilityMinLod;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&local_90->capabilities,&local_94);
    uVar14 = uVar14 | 0x80;
    uVar12 = (ulong)uVar10;
    uVar10 = uVar10 + 1;
    *(Id *)((long)&local_68 + uVar12 * 4) = parameters->lodClamp;
LAB_001b6db9:
    *(uint *)((long)&local_68 + uVar11 * 4) = uVar14;
  }
  pBVar4 = local_90;
  if (fetch) {
    OVar5 = OpImageSparseFetch;
    OVar13 = OpImageFetch;
  }
  else {
    IVar6 = parameters->Dref;
    if (gather) {
      if (IVar6 == 0) {
        OVar5 = OpImageSparseGather;
        OVar13 = OpImageGather;
      }
      else {
        OVar5 = OpImageSparseDrefGather;
        OVar13 = OpImageDrefGather;
      }
      if (sparse) {
        OVar13 = OVar5;
      }
      goto LAB_001b6e95;
    }
    if (bVar3) {
      if (IVar6 == 0) {
        if ((char)local_88 == '\0') {
          OVar5 = OpImageSparseSampleExplicitLod;
          OVar13 = OpImageSampleExplicitLod;
        }
        else {
          OVar5 = OpImageSparseSampleProjExplicitLod;
          OVar13 = OpImageSampleProjExplicitLod;
        }
      }
      else if ((char)local_88 == '\0') {
        OVar5 = OpImageSparseSampleDrefExplicitLod;
        OVar13 = OpImageSampleDrefExplicitLod;
      }
      else {
        OVar5 = OpImageSparseSampleProjDrefExplicitLod;
        OVar13 = OpImageSampleProjDrefExplicitLod;
      }
    }
    else if (IVar6 == 0) {
      if ((char)local_88 == '\0') {
        OVar5 = OpImageSparseSampleImplicitLod;
        OVar13 = OpImageSampleImplicitLod;
      }
      else {
        OVar5 = OpImageSparseSampleProjImplicitLod;
        OVar13 = OpImageSampleProjImplicitLod;
      }
    }
    else if ((char)local_88 == '\0') {
      OVar5 = OpImageSparseSampleDrefImplicitLod;
      OVar13 = OpImageSampleDrefImplicitLod;
    }
    else {
      OVar5 = OpImageSparseSampleProjDrefImplicitLod;
      OVar13 = OpImageSampleProjDrefImplicitLod;
    }
  }
  if (sparse) {
    OVar13 = OVar5;
  }
LAB_001b6e95:
  IVar6 = local_7c;
  if (((2 < (local_90->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start[local_7c]->opCode - OpTypeBool) &&
      (OVar13 - OpImageSampleDrefImplicitLod < 6)) &&
     ((0x33U >> (OVar13 - OpImageSampleDrefImplicitLod & 0x1f) & 1) != 0)) {
    IVar6 = getScalarTypeId(local_90,local_7c);
  }
  if (sparse) {
    local_84 = getDerefTypeId(pBVar4,parameters->texelOut);
    IVar7 = makeStructResultType(pBVar4,IVar6,local_84);
    local_80 = IVar6;
  }
  else {
    local_80 = 0;
    local_84 = 0;
    IVar7 = IVar6;
  }
  instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
  IVar6 = pBVar4->uniqueId + 1;
  pBVar4->uniqueId = IVar6;
  instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
  instruction->resultId = IVar6;
  instruction->typeId = IVar7;
  instruction->opCode = OVar13;
  this_00 = &instruction->operands;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (instruction->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  instruction->block = (Block *)0x0;
  uVar12 = 0;
  local_88 = IVar7;
  do {
    local_94 = *(Capability *)((long)&local_68 + uVar12 * 4);
    iVar1._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar1,
                 &local_94);
    }
    else {
      *iVar1._M_current = local_94;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    pBVar4 = local_90;
    uVar12 = uVar12 + 1;
  } while (uVar11 != uVar12);
  if ((int)local_38 < (int)uVar10) {
    local_94 = *(Capability *)((long)&local_68 + uVar11 * 4);
    iVar1._M_current =
         (instruction->operands).
         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
      _M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,iVar1,
                 &local_94);
    }
    else {
      *iVar1._M_current = local_94;
      (instruction->operands).
      super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
  }
  if ((int)local_70 < (int)uVar10) {
    uVar11 = uVar11 + 1;
    do {
      local_94 = *(Capability *)((long)&local_68 + uVar11 * 4);
      iVar1._M_current =
           (instruction->operands).
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (instruction->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)this_00,
                   iVar1,&local_94);
      }
      else {
        *iVar1._M_current = local_94;
        (instruction->operands).
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
  precision_00 = local_6c;
  if (instruction->resultId != 0 && local_6c != DecorationMax) {
    addDecoration(pBVar4,instruction->resultId,local_6c,-1);
  }
  pBVar2 = pBVar4->buildPoint;
  local_78._M_head_impl = instruction;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar2->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_78);
  instruction->block = pBVar2;
  if (instruction->resultId != 0) {
    Module::mapInstruction(pBVar2->parent->parent,instruction);
  }
  if (local_78._M_head_impl != (Instruction *)0x0) {
    (*(local_78._M_head_impl)->_vptr_Instruction[1])();
  }
  local_78._M_head_impl = (Instruction *)0x0;
  IVar6 = instruction->resultId;
  if (sparse) {
    local_94 = CapabilitySparseResidency;
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar4->capabilities,&local_94);
    IVar7 = createCompositeExtract(pBVar4,IVar6,local_84,1);
    createStore(pBVar4,IVar7,parameters->texelOut);
    IVar6 = createCompositeExtract(pBVar4,IVar6,local_80,0);
    if ((precision_00 != DecorationMax) && (IVar6 != 0)) {
      addDecoration(pBVar4,IVar6,precision_00,-1);
    }
  }
  else if (local_88 != local_7c) {
    IVar6 = smearScalar(pBVar4,precision_00,IVar6,local_7c);
  }
  return IVar6;
}

Assistant:

Id Builder::createTextureCall(Decoration precision, Id resultType, bool sparse, bool fetch, bool proj, bool gather, bool noImplicitLod, const TextureParameters& parameters)
{
    static const int maxTextureArgs = 10;
    Id texArgs[maxTextureArgs] = {};

    //
    // Set up the fixed arguments
    //
    int numArgs = 0;
    bool explicitLod = false;
    texArgs[numArgs++] = parameters.sampler;
    texArgs[numArgs++] = parameters.coords;
    if (parameters.Dref != NoResult)
        texArgs[numArgs++] = parameters.Dref;
    if (parameters.component != NoResult)
        texArgs[numArgs++] = parameters.component;

    //
    // Set up the optional arguments
    //
    int optArgNum = numArgs;                        // track which operand, if it exists, is the mask of optional arguments
    ++numArgs;                                      // speculatively make room for the mask operand
    ImageOperandsMask mask = ImageOperandsMaskNone; // the mask operand
    if (parameters.bias) {
        mask = (ImageOperandsMask)(mask | ImageOperandsBiasMask);
        texArgs[numArgs++] = parameters.bias;
    }
    if (parameters.lod) {
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = parameters.lod;
        explicitLod = true;
    } else if (parameters.gradX) {
        mask = (ImageOperandsMask)(mask | ImageOperandsGradMask);
        texArgs[numArgs++] = parameters.gradX;
        texArgs[numArgs++] = parameters.gradY;
        explicitLod = true;
    } else if (noImplicitLod && ! fetch && ! gather) {
        // have to explicitly use lod of 0 if not allowed to have them be implicit, and
        // we would otherwise be about to issue an implicit instruction
        mask = (ImageOperandsMask)(mask | ImageOperandsLodMask);
        texArgs[numArgs++] = makeFloatConstant(0.0);
        explicitLod = true;
    }
    if (parameters.offset) {
        if (isConstant(parameters.offset))
            mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetMask);
        else {
            addCapability(CapabilityImageGatherExtended);
            mask = (ImageOperandsMask)(mask | ImageOperandsOffsetMask);
        }
        texArgs[numArgs++] = parameters.offset;
    }
    if (parameters.offsets) {
        mask = (ImageOperandsMask)(mask | ImageOperandsConstOffsetsMask);
        texArgs[numArgs++] = parameters.offsets;
    }
    if (parameters.sample) {
        mask = (ImageOperandsMask)(mask | ImageOperandsSampleMask);
        texArgs[numArgs++] = parameters.sample;
    }
    if (parameters.lodClamp) {
        // capability if this bit is used
        addCapability(CapabilityMinLod);

        mask = (ImageOperandsMask)(mask | ImageOperandsMinLodMask);
        texArgs[numArgs++] = parameters.lodClamp;
    }
    if (mask == ImageOperandsMaskNone)
        --numArgs;  // undo speculative reservation for the mask argument
    else
        texArgs[optArgNum] = mask;

    //
    // Set up the instruction
    //
    Op opCode = OpNop;  // All paths below need to set this
    if (fetch) {
        if (sparse)
            opCode = OpImageSparseFetch;
        else
            opCode = OpImageFetch;
    } else if (gather) {
        if (parameters.Dref)
            if (sparse)
                opCode = OpImageSparseDrefGather;
            else
                opCode = OpImageDrefGather;
        else
            if (sparse)
                opCode = OpImageSparseGather;
            else
                opCode = OpImageGather;
    } else if (explicitLod) {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefExplicitLod;
                else
                    opCode = OpImageSampleProjDrefExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefExplicitLod;
                else
                    opCode = OpImageSampleDrefExplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjExplicitLod;
                else
                    opCode = OpImageSampleProjExplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleExplicitLod;
                else
                    opCode = OpImageSampleExplicitLod;
        }
    } else {
        if (parameters.Dref) {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjDrefImplicitLod;
                else
                    opCode = OpImageSampleProjDrefImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleDrefImplicitLod;
                else
                    opCode = OpImageSampleDrefImplicitLod;
        } else {
            if (proj)
                if (sparse)
                    opCode = OpImageSparseSampleProjImplicitLod;
                else
                    opCode = OpImageSampleProjImplicitLod;
            else
                if (sparse)
                    opCode = OpImageSparseSampleImplicitLod;
                else
                    opCode = OpImageSampleImplicitLod;
        }
    }

    // See if the result type is expecting a smeared result.
    // This happens when a legacy shadow*() call is made, which
    // gets a vec4 back instead of a float.
    Id smearedType = resultType;
    if (! isScalarType(resultType)) {
        switch (opCode) {
        case OpImageSampleDrefImplicitLod:
        case OpImageSampleDrefExplicitLod:
        case OpImageSampleProjDrefImplicitLod:
        case OpImageSampleProjDrefExplicitLod:
            resultType = getScalarTypeId(resultType);
            break;
        default:
            break;
        }
    }

    Id typeId0 = 0;
    Id typeId1 = 0;

    if (sparse) {
        typeId0 = resultType;
        typeId1 = getDerefTypeId(parameters.texelOut);
        resultType = makeStructResultType(typeId0, typeId1);
    }

    // Build the SPIR-V instruction
    Instruction* textureInst = new Instruction(getUniqueId(), resultType, opCode);
    for (int op = 0; op < optArgNum; ++op)
        textureInst->addIdOperand(texArgs[op]);
    if (optArgNum < numArgs)
        textureInst->addImmediateOperand(texArgs[optArgNum]);
    for (int op = optArgNum + 1; op < numArgs; ++op)
        textureInst->addIdOperand(texArgs[op]);
    setPrecision(textureInst->getResultId(), precision);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(textureInst));

    Id resultId = textureInst->getResultId();

    if (sparse) {
        // set capability
        addCapability(CapabilitySparseResidency);

        // Decode the return type that was a special structure
        createStore(createCompositeExtract(resultId, typeId1, 1), parameters.texelOut);
        resultId = createCompositeExtract(resultId, typeId0, 0);
        setPrecision(resultId, precision);
    } else {
        // When a smear is needed, do it, as per what was computed
        // above when resultType was changed to a scalar type.
        if (resultType != smearedType)
            resultId = smearScalar(precision, resultId, smearedType);
    }

    return resultId;
}